

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O2

void lj_err_run(lua_State *L)

{
  uint *puVar1;
  uint uVar2;
  int errcode;
  TValue *pTVar3;
  GCstr *pGVar4;
  TValue *pTVar5;
  void *pvVar6;
  long lVar7;
  
  pTVar5 = L->base + -1;
  pTVar3 = (TValue *)(ulong)(L->stack).ptr32;
  pvVar6 = L->cframe;
LAB_00109673:
  if (pTVar5 < pTVar3 || (long)pTVar5 - (long)pTVar3 == 0) {
LAB_00109728:
    errcode = 2;
LAB_0010972a:
    lj_err_throw(L,errcode);
  }
  while( true ) {
    if (pvVar6 == (void *)0x0) goto LAB_00109728;
    if ((-1 < *(int *)(((ulong)pvVar6 & 0xfffffffffffffffc) + 0x10)) ||
       ((TValue *)((long)pTVar3 - (long)*(int *)((long)pvVar6 + 0x10)) <= pTVar5)) break;
    lVar7 = (long)*(int *)((long)pvVar6 + 0x14);
    if (-1 < lVar7) goto LAB_00109723;
    pvVar6 = *(void **)((long)pvVar6 + 0x20);
  }
  uVar2 = (pTVar5->field_2).it;
  switch(uVar2 & 7) {
  default:
    pTVar5 = pTVar5 + (-1 - (ulong)*(byte *)((ulong)uVar2 - 3));
    goto LAB_00109673;
  case 1:
    pvVar6 = *(void **)((long)pvVar6 + 0x20);
  case 3:
switchD_001096c9_caseD_3:
    pTVar5 = (TValue *)((long)pTVar5 - ((long)(int)uVar2 & 0xfffffffffffffff8U));
    goto LAB_00109673;
  case 2:
    goto switchD_001096c9_caseD_2;
  case 5:
    if (((ulong)pvVar6 & 1) != 0) goto LAB_00109728;
    lVar7 = (long)*(int *)((long)pvVar6 + 0x14);
    if (lVar7 < 0) goto switchD_001096c9_caseD_3;
    break;
  case 6:
  case 7:
    if ((int)uVar2 < 0x10) goto LAB_00109728;
    lVar7 = ((long)pTVar5 - (long)pTVar3) + -8;
  }
LAB_00109723:
  if (lVar7 != 0) {
    pTVar5 = L->top;
    puVar1 = (uint *)((ulong)(L->glref).ptr32 + 0x254);
    *puVar1 = *puVar1 & 0xffffffef;
    if ((*(int *)((long)pTVar3 + lVar7 + 4) != -9) || (L->status == '\x05')) {
      pGVar4 = lj_err_str(L,LJ_ERR_ERRERR);
      pTVar5[-1].u32.lo = (uint32_t)pGVar4;
      *(undefined4 *)((long)pTVar5 + -4) = 0xfffffffb;
      errcode = 5;
      goto LAB_0010972a;
    }
    L->status = '\x05';
    *pTVar5 = pTVar5[-1];
    pTVar5[-1] = *(TValue *)((long)pTVar3 + lVar7);
    L->top = pTVar5 + 1;
    lj_vm_call(L,pTVar5,2);
  }
  goto LAB_00109728;
switchD_001096c9_caseD_2:
  if (pTVar5[-1].u32.lo == 1) {
    pvVar6 = *(void **)((long)pvVar6 + 0x20);
  }
  pTVar5 = (TValue *)((long)pTVar5 - (long)(int)(uVar2 & 0xfffffff8));
  goto LAB_00109673;
}

Assistant:

LJ_NOINLINE void lj_err_run(lua_State *L)
{
  ptrdiff_t ef = finderrfunc(L);
  if (ef) {
    TValue *errfunc = restorestack(L, ef);
    TValue *top = L->top;
    lj_trace_abort(G(L));
    if (!tvisfunc(errfunc) || L->status == LUA_ERRERR) {
      setstrV(L, top-1, lj_err_str(L, LJ_ERR_ERRERR));
      lj_err_throw(L, LUA_ERRERR);
    }
    L->status = LUA_ERRERR;
    copyTV(L, top, top-1);
    copyTV(L, top-1, errfunc);
    L->top = top+1;
    lj_vm_call(L, top, 1+1);  /* Stack: |errfunc|msg| -> |msg| */
  }
  lj_err_throw(L, LUA_ERRRUN);
}